

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall duckdb_parquet::KeyValue::write(KeyValue *this,int __fd,void *__buf,size_t __n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_14;
  
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker
            ((TOutputRecursionTracker *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeStructBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)in_stack_ffffffffffffff98);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (char *)in_stack_ffffffffffffff98,T_STOP,0x224);
  uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeString
                    ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (string *)in_stack_ffffffffffffff98);
  uVar4 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x224ff14);
  local_14 = uVar4 + uVar1 + uVar2 + uVar3;
  if (((byte)this->__isset & 1) != 0) {
    uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)in_stack_ffffffffffffff98,T_STOP,0x224);
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeString
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (string *)in_stack_ffffffffffffff98);
    uVar3 = duckdb_apache::thrift::protocol::TProtocol::writeFieldEnd((TProtocol *)0x224ff98);
    local_14 = uVar3 + local_14 + uVar1 + uVar2;
  }
  uVar1 = duckdb_apache::thrift::protocol::TProtocol::writeFieldStop((TProtocol *)0x224ffd0);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::writeStructEnd((TProtocol *)0x224ffee);
  uVar5 = uVar2 + local_14 + uVar1;
  duckdb_apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker
            ((TOutputRecursionTracker *)0x2250012);
  return (ulong)uVar5;
}

Assistant:

uint32_t KeyValue::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("KeyValue");

  xfer += oprot->writeFieldBegin("key", ::apache::thrift::protocol::T_STRING, 1);
  xfer += oprot->writeString(this->key);
  xfer += oprot->writeFieldEnd();

  if (this->__isset.value) {
    xfer += oprot->writeFieldBegin("value", ::apache::thrift::protocol::T_STRING, 2);
    xfer += oprot->writeString(this->value);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}